

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall
IRBuilder::BuildReg3C
          (IRBuilder *this,OpCode newOpCode,uint32 offset,RegSlot dstRegSlot,RegSlot src1RegSlot,
          RegSlot src2RegSlot,CacheId inlineCacheIndex)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *src1Opnd;
  RegOpnd *pRVar4;
  RegOpnd *dstOpnd;
  RegOpnd *dstOpnd_00;
  Instr *pIVar5;
  IntConstOpnd *src1Opnd_00;
  
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpCode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x898,"(OpCodeAttr::HasMultiSizeLayout(newOpCode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpCode)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  src1Opnd = BuildSrcOpnd(this,src1RegSlot,TyVar);
  pRVar4 = BuildSrcOpnd(this,src2RegSlot,TyVar);
  dstOpnd = BuildDstOpnd(this,dstRegSlot,TyVar,false,false);
  dstOpnd_00 = IR::RegOpnd::New(TyVar,this->m_func);
  pIVar5 = IR::Instr::New(ArgOut_A,&dstOpnd_00->super_Opnd,&pRVar4->super_Opnd,this->m_func);
  AddInstr(this,pIVar5,offset);
  pRVar4 = IR::RegOpnd::New(TyVar,this->m_func);
  pIVar5 = IR::Instr::New(ArgOut_A,&pRVar4->super_Opnd,&src1Opnd->super_Opnd,pIVar5->m_dst,
                          this->m_func);
  AddInstr(this,pIVar5,0xffffffff);
  src1Opnd_00 = IR::IntConstOpnd::New((ulong)inlineCacheIndex,TyUint32,this->m_func,false);
  pIVar5 = IR::Instr::New(newOpCode,&dstOpnd->super_Opnd,&src1Opnd_00->super_Opnd,pIVar5->m_dst,
                          this->m_func);
  AddInstr(this,pIVar5,0xffffffff);
  return;
}

Assistant:

void
IRBuilder::BuildReg3C(Js::OpCode newOpCode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot src1RegSlot,
                            Js::RegSlot src2RegSlot, Js::CacheId inlineCacheIndex)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpCode));

    IR::Instr *     instr;
    IR::RegOpnd *   src1Opnd = this->BuildSrcOpnd(src1RegSlot);
    IR::RegOpnd *   src2Opnd = this->BuildSrcOpnd(src2RegSlot);
    IR::RegOpnd *   dstOpnd = this->BuildDstOpnd(dstRegSlot);

    instr = IR::Instr::New(Js::OpCode::ArgOut_A, IR::RegOpnd::New(TyVar, m_func), src2Opnd, m_func);
    this->AddInstr(instr, offset);

    instr = IR::Instr::New(Js::OpCode::ArgOut_A, IR::RegOpnd::New(TyVar, m_func), src1Opnd, instr->GetDst(), m_func);
    this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

    instr = IR::Instr::New(newOpCode, dstOpnd, IR::IntConstOpnd::New(inlineCacheIndex, TyUint32, m_func), instr->GetDst(), m_func);
    this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
}